

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewind.cpp
# Opt level: O1

void anon_unknown.dwarf_9b08f::write_value_label(FILE *report_dot,Value *v,bool inline_mode)

{
  char *pcVar1;
  undefined7 in_register_00000011;
  int __c;
  
  if ((int)CONCAT71(in_register_00000011,inline_mode) != 0) {
    fwrite("=> ",3,1,(FILE *)report_dot);
  }
  if (v->type == MEM) {
    fprintf((FILE *)report_dot,"mem %06X",(ulong)v->adress);
  }
  else {
    fprint_thing(report_dot,1 << ((byte)v->type & 0x1f));
  }
  __c = 0x3d;
  if (!inline_mode) {
    __c = 10;
  }
  fputc(__c,(FILE *)report_dot);
  pcVar1 = "\nimmediate %02X";
  if (v->wide != false) {
    pcVar1 = "\nimmediate %04X";
  }
  fprintf((FILE *)report_dot,pcVar1 + 0xb,(ulong)v->value);
  fputc(10,(FILE *)report_dot);
  return;
}

Assistant:

void write_value_label(FILE *report_dot, const snestistics::tracking::Value &v, const bool inline_mode = false) {
	if (inline_mode) {
		fprintf(report_dot, "=> ");
	}
	if (v.type == tracking::Value::MEM) {
		fprintf(report_dot, "mem %06X", v.adress);
	} else {
		fprint_thing(report_dot, 1<<(uint32_t)v.type);
	}
	if (inline_mode) {
		fprintf(report_dot, "=");
	} else {
		fprintf(report_dot, "\n");
	}
	if (v.wide) {
		fprintf(report_dot, "%04X", v.value);
	} else {
		fprintf(report_dot, "%02X", v.value);
	}
	fprintf(report_dot, "\n");
}